

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::PerfEvents_Tracepoint::ParseFromArray
          (PerfEvents_Tracepoint *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *puVar8;
  uint8_t cur_byte_3;
  ulong uVar9;
  uint8_t cur_byte_2;
  uint8_t cur_byte;
  ulong *puVar10;
  uint8_t cur_byte_1;
  Field local_50;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  local_38 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar6 = (ulong *)(size + (long)raw);
  do {
    if (puVar6 <= raw) goto switchD_0022b1b8_caseD_3;
    bVar1 = (byte)*raw;
    uVar5 = (ulong)bVar1;
    puVar8 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar5 = (ulong)(bVar1 & 0x7f);
      lVar4 = 7;
      do {
        if ((puVar6 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_0022b1b8_caseD_3;
        uVar3 = *puVar8;
        puVar8 = (ulong *)((long)puVar8 + 1);
        uVar5 = uVar5 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
        lVar4 = lVar4 + 7;
      } while ((char)(byte)uVar3 < '\0');
    }
    uVar3 = uVar5 >> 3;
    if (((uint)uVar3 == 0) || (puVar6 <= puVar8)) goto switchD_0022b1b8_caseD_3;
    switch((uint)uVar5 & 7) {
    case 0:
      uVar7 = 0;
      uVar9 = 0;
      while( true ) {
        puVar10 = (ulong *)((long)puVar8 + 1);
        uVar7 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar9 & 0x3f) | uVar7;
        if (-1 < (char)(byte)*puVar8) break;
        if ((puVar6 <= puVar10) ||
           (bVar2 = 0x38 < uVar9, uVar9 = uVar9 + 7, puVar8 = puVar10, bVar2))
        goto switchD_0022b1b8_caseD_3;
      }
      local_50.int_value_ = uVar7 & 0xffffffff00000000;
      break;
    case 1:
      puVar10 = puVar8 + 1;
      if (puVar6 < puVar10) goto switchD_0022b1b8_caseD_3;
      uVar7 = *puVar8;
      local_50.int_value_ = uVar7 & 0xffffffff00000000;
      break;
    case 2:
      puVar8 = (ulong *)((long)puVar8 + 1);
      uVar9 = 0;
      uVar7 = 0;
      puVar10 = puVar8;
      while (uVar9 = (ulong)(*(byte *)((long)puVar10 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) | uVar9,
            (char)*(byte *)((long)puVar10 + -1) < '\0') {
        if (puVar6 <= puVar10) goto switchD_0022b1b8_caseD_3;
        puVar10 = (ulong *)((long)puVar10 + 1);
        puVar8 = (ulong *)((long)puVar8 + 1);
        bVar2 = 0x38 < uVar7;
        uVar7 = uVar7 + 7;
        if (bVar2) goto switchD_0022b1b8_caseD_3;
      }
      if (uVar9 <= (ulong)((long)puVar6 - (long)puVar8)) {
        local_50.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
        puVar10 = (ulong *)((long)puVar10 + uVar9);
        uVar7 = (ulong)puVar8 & 0xffffffff;
        goto LAB_0022b293;
      }
    default:
      goto switchD_0022b1b8_caseD_3;
    case 5:
      puVar10 = (ulong *)((long)puVar8 + 4);
      if (puVar6 < puVar10) goto switchD_0022b1b8_caseD_3;
      uVar7 = (ulong)(uint)*puVar8;
      local_50.int_value_ = 0;
    }
    uVar9 = 0;
LAB_0022b293:
    raw = puVar10;
  } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar9));
  local_50.int_value_ = local_50.int_value_ | uVar7 & 0xffffffff;
  uVar7 = uVar3 << 0x20 | uVar9;
  local_50.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar5 & 7;
  local_50.size_ = (uint32_t)uVar9;
  local_50.id_ = (uint16_t)(uVar7 >> 0x20);
  if ((short)uVar3 != 0) {
    local_40 = &this->filter_;
    do {
      if ((ushort)uVar3 < 3) {
        (this->_has_field_).super__Base_bitset<1UL>._M_w =
             (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar3 & 0x3f);
      }
      raw = puVar10;
      if ((ushort)uVar3 == 2) {
        protozero::Field::get(&local_50,local_40);
      }
      else if (((uint)uVar3 & 0xffff) == 1) {
        protozero::Field::get(&local_50,&this->name_);
      }
      else {
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_50,local_38);
      }
      do {
        if (puVar6 <= raw) goto switchD_0022b1b8_caseD_3;
        bVar1 = (byte)*raw;
        uVar5 = (ulong)(uint)bVar1;
        puVar8 = (ulong *)((long)raw + 1);
        if ((char)bVar1 < '\0') {
          uVar5 = (ulong)(bVar1 & 0x7f);
          lVar4 = 7;
          do {
            if ((puVar6 <= puVar8) || (0x38 < lVar4 - 7U)) goto switchD_0022b1b8_caseD_3;
            uVar3 = *puVar8;
            puVar8 = (ulong *)((long)puVar8 + 1);
            uVar5 = uVar5 | (ulong)((byte)uVar3 & 0x7f) << ((byte)lVar4 & 0x3f);
            lVar4 = lVar4 + 7;
          } while ((char)(byte)uVar3 < '\0');
        }
        uVar3 = uVar5 >> 3;
        if (((uint)uVar3 == 0) || (puVar6 <= puVar8)) goto switchD_0022b1b8_caseD_3;
        switch((uint)uVar5 & 7) {
        case 0:
          uVar7 = 0;
          uVar9 = 0;
          while( true ) {
            puVar10 = (ulong *)((long)puVar8 + 1);
            uVar7 = (ulong)((byte)*puVar8 & 0x7f) << ((byte)uVar9 & 0x3f) | uVar7;
            if (-1 < (char)(byte)*puVar8) break;
            if ((puVar6 <= puVar10) ||
               (bVar2 = 0x38 < uVar9, uVar9 = uVar9 + 7, puVar8 = puVar10, bVar2))
            goto switchD_0022b1b8_caseD_3;
          }
          local_50.int_value_ = uVar7 & 0xffffffff00000000;
          break;
        case 1:
          puVar10 = puVar8 + 1;
          if (puVar6 < puVar10) goto switchD_0022b1b8_caseD_3;
          uVar7 = *puVar8;
          local_50.int_value_ = uVar7 & 0xffffffff00000000;
          break;
        case 2:
          puVar8 = (ulong *)((long)puVar8 + 1);
          uVar9 = 0;
          uVar7 = 0;
          puVar10 = puVar8;
          while (uVar9 = (ulong)(*(byte *)((long)puVar10 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) |
                         uVar9, (char)*(byte *)((long)puVar10 + -1) < '\0') {
            if (puVar6 <= puVar10) goto switchD_0022b1b8_caseD_3;
            puVar10 = (ulong *)((long)puVar10 + 1);
            puVar8 = (ulong *)((long)puVar8 + 1);
            bVar2 = 0x38 < uVar7;
            uVar7 = uVar7 + 7;
            if (bVar2) goto switchD_0022b1b8_caseD_3;
          }
          if (uVar9 <= (ulong)((long)puVar6 - (long)puVar8)) {
            local_50.int_value_ = (ulong)puVar8 & 0xffffffff00000000;
            puVar10 = (ulong *)((long)puVar10 + uVar9);
            uVar7 = (ulong)puVar8 & 0xffffffff;
            goto LAB_0022b53f;
          }
        default:
          goto switchD_0022b1b8_caseD_3;
        case 5:
          puVar10 = (ulong *)((long)puVar8 + 4);
          if (puVar6 < puVar10) goto switchD_0022b1b8_caseD_3;
          uVar7 = (ulong)(uint)*puVar8;
          local_50.int_value_ = 0;
        }
        uVar9 = 0;
LAB_0022b53f:
        raw = puVar10;
      } while ((0xffff < (uint)uVar3) || (0xfffffff < uVar9));
      local_50.int_value_ = local_50.int_value_ | uVar7 & 0xffffffff;
      uVar7 = uVar3 << 0x20 | uVar9;
      local_50.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar5 & 7;
      local_50.size_ = (uint32_t)uVar9;
      local_50.id_ = (uint16_t)(uVar7 >> 0x20);
    } while ((short)uVar3 != 0);
  }
switchD_0022b1b8_caseD_3:
  return puVar6 == (ulong *)raw;
}

Assistant:

bool PerfEvents_Tracepoint::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* name */:
        field.get(&name_);
        break;
      case 2 /* filter */:
        field.get(&filter_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}